

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unicodeNext(sqlite3_tokenizer_cursor *pC,char **paToken,int *pnToken,int *piStart,int *piEnd,
               int *piPos)

{
  unicode_tokenizer *p;
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  sqlite3_tokenizer *psVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  sqlite3_tokenizer *psVar13;
  uint iCode;
  bool bVar14;
  byte *local_78;
  
  p = (unicode_tokenizer *)pC->pTokenizer;
  iVar3 = *(int *)((long)&pC[2].pTokenizer + 4);
  pbVar6 = (byte *)((long)&(pC[1].pTokenizer)->pModule + (long)iVar3);
  iVar4 = *(int *)&pC[2].pTokenizer;
  pbVar7 = (byte *)((long)&(pC[1].pTokenizer)->pModule + (long)iVar4);
  iCode = 0;
  bVar14 = iVar3 < iVar4;
  pbVar8 = pbVar6;
  if (iVar3 < iVar4) {
    do {
      pbVar8 = pbVar6 + 1;
      bVar1 = *pbVar6;
      iCode = (uint)bVar1;
      if (0xbf < bVar1) {
        uVar2 = (uint)""[bVar1 - 0xc0];
        for (; (pbVar8 != pbVar7 && ((*pbVar8 & 0xffffffc0) == 0x80)); pbVar8 = pbVar8 + 1) {
          uVar2 = uVar2 << 6 | *pbVar8 & 0x3f;
        }
        iCode = uVar2;
        if ((uVar2 & 0xfffff800) == 0xd800) {
          iCode = 0xfffd;
        }
        if (uVar2 < 0x80) {
          iCode = 0xfffd;
        }
        if ((uVar2 & 0xfffffffe) == 0xfffe) {
          iCode = 0xfffd;
        }
      }
      iVar3 = unicodeIsAlnum(p,iCode);
    } while ((iVar3 == 0) && (bVar14 = pbVar8 < pbVar7, pbVar6 = pbVar8, bVar14));
  }
  iVar3 = 0x65;
  if (bVar14) {
    psVar13 = pC[4].pTokenizer;
    do {
      do {
        psVar5 = pC[4].pTokenizer;
        iVar3 = *(int *)&pC[5].pTokenizer;
        pbVar12 = pbVar8;
        if ((long)psVar13 - (long)psVar5 < (long)iVar3 + -4) {
LAB_001b3592:
          uVar2 = iCode;
          if ((int)iCode < 0x80) {
            uVar2 = iCode | 0x20;
            bVar14 = iCode - 0x41 < 0x1a;
LAB_001b36c6:
            if (!bVar14) {
              uVar2 = iCode;
            }
          }
          else {
            if (0xffff < (int)iCode) {
              uVar2 = iCode + 0x28;
              bVar14 = iCode - 0x10400 < 0x28;
              goto LAB_001b36c6;
            }
            iVar3 = 0;
            iVar4 = -1;
            iVar11 = 0xa2;
            do {
              iVar10 = (iVar3 + iVar11) / 2;
              if ((int)iCode <
                  (int)(uint)*(ushort *)(sqlite3FtsUnicodeFold_aEntry + (long)iVar10 * 4)) {
                iVar11 = iVar10 + -1;
              }
              else {
                iVar3 = iVar10 + 1;
                iVar4 = iVar10;
              }
            } while (iVar3 <= iVar11);
            lVar9 = (long)iVar4;
            if (((int)iCode <
                 (int)((uint)(byte)sqlite3FtsUnicodeFold_aEntry[lVar9 * 4 + 3] +
                      (uint)*(ushort *)(sqlite3FtsUnicodeFold_aEntry + lVar9 * 4))) &&
               (((*(ushort *)(sqlite3FtsUnicodeFold_aEntry + lVar9 * 4) ^ iCode) &
                 (uint)(byte)sqlite3FtsUnicodeFold_aEntry[lVar9 * 4 + 2] & 1) == 0)) {
              uVar2 = (uint)(ushort)(*(short *)((long)sqlite3Fts5UnicodeFold::aiOff +
                                               (ulong)((byte)sqlite3FtsUnicodeFold_aEntry
                                                             [lVar9 * 4 + 2] & 0xfffffffe)) +
                                    (short)iCode);
            }
            if (p->eRemoveDiacritic != 0) {
              iVar11 = 0x7d;
              iVar3 = 0;
              iVar4 = 0;
              do {
                iVar10 = (iVar11 + iVar3) / 2;
                if (uVar2 * 8 + 7 < (uint)*(ushort *)(&DAT_001dec40 + (long)iVar10 * 2)) {
                  iVar11 = iVar10 + -1;
                }
                else {
                  iVar3 = iVar10 + 1;
                  iVar4 = iVar10;
                }
              } while (iVar3 <= iVar11);
              lVar9 = (long)iVar4;
              if (((p->eRemoveDiacritic == 2) || (-1 < (char)(&DAT_001ded40)[lVar9])) &&
                 ((int)uVar2 <=
                  (int)((*(ushort *)(&DAT_001dec40 + lVar9 * 2) & 7) +
                       (uint)(*(ushort *)(&DAT_001dec40 + lVar9 * 2) >> 3)))) {
                uVar2 = (byte)(&DAT_001ded40)[lVar9] & 0x7f;
              }
            }
          }
          if (uVar2 != 0) {
            bVar1 = (byte)uVar2;
            if ((int)uVar2 < 0x80) {
              *(byte *)&psVar13->pModule = bVar1;
              psVar13 = (sqlite3_tokenizer *)((long)&psVar13->pModule + 1);
            }
            else if ((int)uVar2 < 0x800) {
              *(byte *)&psVar13->pModule = (byte)(uVar2 >> 6) & 0x1f | 0xc0;
              *(byte *)((long)&psVar13->pModule + 1) = bVar1 & 0x3f | 0x80;
              psVar13 = (sqlite3_tokenizer *)((long)&psVar13->pModule + 2);
            }
            else if ((int)uVar2 < 0x10000) {
              *(byte *)&psVar13->pModule = (byte)(uVar2 >> 0xc) & 0xf | 0xe0;
              *(byte *)((long)&psVar13->pModule + 1) = (byte)(uVar2 >> 6) & 0x3f | 0x80;
              *(byte *)((long)&psVar13->pModule + 2) = bVar1 & 0x3f | 0x80;
              psVar13 = (sqlite3_tokenizer *)((long)&psVar13->pModule + 3);
            }
            else {
              *(byte *)&psVar13->pModule = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
              *(byte *)((long)&psVar13->pModule + 1) = (byte)(uVar2 >> 0xc) & 0x3f | 0x80;
              *(byte *)((long)&psVar13->pModule + 2) = (byte)(uVar2 >> 6) & 0x3f | 0x80;
              *(byte *)((long)&psVar13->pModule + 3) = bVar1 & 0x3f | 0x80;
              psVar13 = (sqlite3_tokenizer *)((long)&psVar13->pModule + 4);
            }
          }
          iVar3 = 6;
          local_78 = pbVar8;
          if (pbVar8 < pbVar7) {
            pbVar12 = pbVar8 + 1;
            bVar1 = *pbVar8;
            iCode = (uint)bVar1;
            iVar3 = 0;
            if (0xbf < bVar1) {
              uVar2 = (uint)""[bVar1 - 0xc0];
              for (; (pbVar12 != pbVar7 && ((*pbVar12 & 0xffffffc0) == 0x80)); pbVar12 = pbVar12 + 1
                  ) {
                uVar2 = uVar2 << 6 | *pbVar12 & 0x3f;
              }
              iCode = uVar2;
              if ((uVar2 & 0xfffff800) == 0xd800) {
                iCode = 0xfffd;
              }
              if (uVar2 < 0x80) {
                iCode = 0xfffd;
              }
              if ((uVar2 & 0xfffffffe) == 0xfffe) {
                iCode = 0xfffd;
                iVar3 = 0;
              }
            }
          }
        }
        else {
          iVar4 = sqlite3_initialize();
          if (iVar4 == 0) {
            psVar5 = (sqlite3_tokenizer *)sqlite3Realloc(psVar5,(long)iVar3 + 0x40);
          }
          else {
            psVar5 = (sqlite3_tokenizer *)0x0;
          }
          if (psVar5 != (sqlite3_tokenizer *)0x0) {
            psVar13 = (sqlite3_tokenizer *)(((long)psVar13 - (long)pC[4].pTokenizer) + (long)psVar5)
            ;
            pC[4].pTokenizer = psVar5;
            *(int *)&pC[5].pTokenizer = *(int *)&pC[5].pTokenizer + 0x40;
            goto LAB_001b3592;
          }
          iVar3 = 1;
        }
        pbVar8 = pbVar12;
        if (iVar3 != 0) {
          if (iVar3 != 6) {
            return 7;
          }
          goto LAB_001b3869;
        }
        iVar3 = unicodeIsAlnum(p,iCode);
      } while (iVar3 != 0);
      uVar2 = 0;
      if (0xffffffcd < iCode - 0x332) {
        uVar2 = 1 << ((byte)iCode & 0x1f);
        if ((int)iCode < 800) {
          uVar2 = uVar2 & 0x8029fdf;
        }
        else {
          uVar2 = uVar2 & 0x361f8;
        }
      }
    } while (uVar2 != 0);
LAB_001b3869:
    *(int *)((long)&pC[2].pTokenizer + 4) = (int)pbVar8 - *(int *)&pC[1].pTokenizer;
    *paToken = (char *)pC[4].pTokenizer;
    *pnToken = (int)psVar13 - *(int *)&pC[4].pTokenizer;
    iVar3 = *(int *)&pC[1].pTokenizer;
    *piStart = (int)pbVar6 - iVar3;
    *piEnd = (int)local_78 - iVar3;
    iVar3 = *(int *)&pC[3].pTokenizer;
    *(int *)&pC[3].pTokenizer = iVar3 + 1;
    *piPos = iVar3;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int unicodeNext(
  sqlite3_tokenizer_cursor *pC,   /* Cursor returned by simpleOpen */
  const char **paToken,           /* OUT: Token text */
  int *pnToken,                   /* OUT: Number of bytes at *paToken */
  int *piStart,                   /* OUT: Starting offset of token */
  int *piEnd,                     /* OUT: Ending offset of token */
  int *piPos                      /* OUT: Position integer of token */
){
  unicode_cursor *pCsr = (unicode_cursor *)pC;
  unicode_tokenizer *p = ((unicode_tokenizer *)pCsr->base.pTokenizer);
  unsigned int iCode = 0;
  char *zOut;
  const unsigned char *z = &pCsr->aInput[pCsr->iOff];
  const unsigned char *zStart = z;
  const unsigned char *zEnd;
  const unsigned char *zTerm = &pCsr->aInput[pCsr->nInput];

  /* Scan past any delimiter characters before the start of the next token.
  ** Return SQLITE_DONE early if this takes us all the way to the end of 
  ** the input.  */
  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    if( unicodeIsAlnum(p, (int)iCode) ) break;
    zStart = z;
  }
  if( zStart>=zTerm ) return SQLITE_DONE;

  zOut = pCsr->zToken;
  do {
    int iOut;

    /* Grow the output buffer if required. */
    if( (zOut-pCsr->zToken)>=(pCsr->nAlloc-4) ){
      char *zNew = sqlite3_realloc64(pCsr->zToken, pCsr->nAlloc+64);
      if( !zNew ) return SQLITE_NOMEM;
      zOut = &zNew[zOut - pCsr->zToken];
      pCsr->zToken = zNew;
      pCsr->nAlloc += 64;
    }

    /* Write the folded case of the last character read to the output */
    zEnd = z;
    iOut = sqlite3FtsUnicodeFold((int)iCode, p->eRemoveDiacritic);
    if( iOut ){
      WRITE_UTF8(zOut, iOut);
    }

    /* If the cursor is not at EOF, read the next character */
    if( z>=zTerm ) break;
    READ_UTF8(z, zTerm, iCode);
  }while( unicodeIsAlnum(p, (int)iCode) 
       || sqlite3FtsUnicodeIsdiacritic((int)iCode)
  );

  /* Set the output variables and return. */
  pCsr->iOff = (int)(z - pCsr->aInput);
  *paToken = pCsr->zToken;
  *pnToken = (int)(zOut - pCsr->zToken);
  *piStart = (int)(zStart - pCsr->aInput);
  *piEnd = (int)(zEnd - pCsr->aInput);
  *piPos = pCsr->iToken++;
  return SQLITE_OK;
}